

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::AssignmentPatternItemSyntax::setChild
          (AssignmentPatternItemSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 2) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->expr).ptr = (ExpressionSyntax *)pSVar1;
  }
  else if (index == 1) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->colon).kind = TVar2.kind;
    (this->colon).field_0x2 = TVar2._2_1_;
    (this->colon).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->colon).rawLen = TVar2.rawLen;
    (this->colon).info = TVar2.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->key).ptr = (ExpressionSyntax *)pSVar1;
  }
  return;
}

Assistant:

void AssignmentPatternItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: key = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: colon = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}